

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O1

size_t derEnc(octet *der,u32 tag,void *val,size_t len)

{
  bool bVar1;
  bool_t bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  
  uVar5 = (ulong)tag;
  bVar2 = derTIsValid(tag);
  sVar7 = 0xffffffffffffffff;
  if (bVar2 != 0) {
    lVar8 = 0;
    if (tag != 0) {
      do {
        lVar8 = lVar8 + 1;
        uVar3 = (uint)uVar5;
        uVar5 = uVar5 >> 8;
      } while (0xff < uVar3);
    }
    sVar7 = lVar8 + (ulong)(lVar8 == 0);
  }
  if (sVar7 == 0xffffffffffffffff) {
    return 0xffffffffffffffff;
  }
  sVar6 = 1;
  uVar5 = len;
  if (0x7f < len) {
    do {
      sVar6 = sVar6 + 1;
      bVar1 = 0xff < uVar5;
      uVar5 = uVar5 >> 8;
    } while (bVar1);
  }
  if (der != (octet *)0x0) {
    memMove(der + sVar7 + sVar6,val,len);
    sVar4 = derTEnc(der,tag);
    if (sVar4 != sVar7) {
      return 0xffffffffffffffff;
    }
    sVar4 = derLEnc(der + sVar7,len);
    if (sVar4 != sVar6) {
      return 0xffffffffffffffff;
    }
  }
  return sVar7 + len + sVar6;
}

Assistant:

size_t derEnc(octet der[], u32 tag, const void* val, size_t len)
{
	size_t t_count;
	size_t l_count;
	// t_count <- len(T)
	t_count = derTEnc(0, tag);
	if (t_count == SIZE_MAX)
		return SIZE_MAX;
	// l_count <- len(L)
	l_count = derLEnc(0, len);
	if (l_count == SIZE_MAX)
		return SIZE_MAX;
	// кодировать?
	if (der)
	{
		ASSERT(memIsValid(val, len));
		ASSERT(memIsValid(der, t_count + l_count + len));
		// der <- TLV
		memMove(der + t_count + l_count, val, len);
		if (derTEnc(der, tag) != t_count ||
			derLEnc(der + t_count, len) != l_count)
			return SIZE_MAX;
	}
	return t_count + l_count + len;
}